

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::V1LayerParameter::Clear(V1LayerParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  V0LayerParameter *this_00;
  ConcatParameter *this_01;
  ConvolutionParameter *this_02;
  DataParameter *this_03;
  DropoutParameter *pDVar4;
  HDF5DataParameter *this_04;
  HDF5OutputParameter *this_05;
  ImageDataParameter *this_06;
  InfogainLossParameter *this_07;
  InnerProductParameter *this_08;
  LRNParameter *this_09;
  PoolingParameter *this_10;
  WindowDataParameter *this_11;
  PowerParameter *this_12;
  MemoryDataParameter *this_13;
  ArgMaxParameter *this_14;
  EltwiseParameter *this_15;
  ThresholdParameter *pTVar5;
  DummyDataParameter *this_16;
  AccuracyParameter *this_17;
  HingeLossParameter *pHVar6;
  ReLUParameter *this_18;
  SliceParameter *this_19;
  MVNParameter *this_20;
  TransformationParameter *this_21;
  TanHParameter *pTVar7;
  SigmoidParameter *pSVar8;
  SoftmaxParameter *this_22;
  ContrastiveLossParameter *this_23;
  ExpParameter *this_24;
  LossParameter *this_25;
  LogFinisher local_51;
  LogMessage local_50;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase);
  (this->blobs_lr_).current_size_ = 0;
  (this->weight_decay_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase);
  (this->loss_weight_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase);
  (this->blob_share_mode_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f55);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      this_00 = this->layer_;
      if (this_00 == (V0LayerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f59);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: layer_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_00 = this->layer_;
      }
      V0LayerParameter::Clear(this_00);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      this_01 = this->concat_param_;
      if (this_01 == (ConcatParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f5d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: concat_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_01 = this->concat_param_;
      }
      ConcatParameter::Clear(this_01);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      this_02 = this->convolution_param_;
      if (this_02 == (ConvolutionParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f61);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: convolution_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_02 = this->convolution_param_;
      }
      ConvolutionParameter::Clear(this_02);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      this_03 = this->data_param_;
      if (this_03 == (DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f65);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_03 = this->data_param_;
      }
      DataParameter::Clear(this_03);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x20) != 0) {
      pDVar4 = this->dropout_param_;
      if (pDVar4 == (DropoutParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f69);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: dropout_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pDVar4 = this->dropout_param_;
      }
      pDVar4->dropout_ratio_ = 0.5;
      (pDVar4->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pDVar4->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pDVar4->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x40) != 0) {
      this_04 = this->hdf5_data_param_;
      if (this_04 == (HDF5DataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f6d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hdf5_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_04 = this->hdf5_data_param_;
      }
      HDF5DataParameter::Clear(this_04);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((char)uVar1 < '\0') {
      this_05 = this->hdf5_output_param_;
      if (this_05 == (HDF5OutputParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f71);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hdf5_output_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_05 = this->hdf5_output_param_;
      }
      HDF5OutputParameter::Clear(this_05);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      this_06 = this->image_data_param_;
      if (this_06 == (ImageDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f77);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: image_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_06 = this->image_data_param_;
      }
      ImageDataParameter::Clear(this_06);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 9 & 1) != 0) {
      this_07 = this->infogain_loss_param_;
      if (this_07 == (InfogainLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: infogain_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_07 = this->infogain_loss_param_;
      }
      InfogainLossParameter::Clear(this_07);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this_08 = this->inner_product_param_;
      if (this_08 == (InnerProductParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f7f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: inner_product_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_08 = this->inner_product_param_;
      }
      InnerProductParameter::Clear(this_08);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      this_09 = this->lrn_param_;
      if (this_09 == (LRNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f83);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: lrn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_09 = this->lrn_param_;
      }
      LRNParameter::Clear(this_09);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this_10 = this->pooling_param_;
      if (this_10 == (PoolingParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f87);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: pooling_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_10 = this->pooling_param_;
      }
      PoolingParameter::Clear(this_10);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this_11 = this->window_data_param_;
      if (this_11 == (WindowDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: window_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_11 = this->window_data_param_;
      }
      WindowDataParameter::Clear(this_11);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      this_12 = this->power_param_;
      if (this_12 == (PowerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f8f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: power_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_12 = this->power_param_;
      }
      PowerParameter::Clear(this_12);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((short)uVar1 < 0) {
      this_13 = this->memory_data_param_;
      if (this_13 == (MemoryDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f93);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: memory_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_13 = this->memory_data_param_;
      }
      MemoryDataParameter::Clear(this_13);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      this_14 = this->argmax_param_;
      if (this_14 == (ArgMaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f99);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: argmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_14 = this->argmax_param_;
      }
      ArgMaxParameter::Clear(this_14);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      this_15 = this->eltwise_param_;
      if (this_15 == (EltwiseParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9f9d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: eltwise_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_15 = this->eltwise_param_;
      }
      EltwiseParameter::Clear(this_15);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      pTVar5 = this->threshold_param_;
      if (pTVar5 == (ThresholdParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa1);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: threshold_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pTVar5 = this->threshold_param_;
      }
      pTVar5->threshold_ = 0.0;
      (pTVar5->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar5->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar5->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x13 & 1) != 0) {
      this_16 = this->dummy_data_param_;
      if (this_16 == (DummyDataParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa5);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: dummy_data_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_16 = this->dummy_data_param_;
      }
      DummyDataParameter::Clear(this_16);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      this_17 = this->accuracy_param_;
      if (this_17 == (AccuracyParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fa9);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: accuracy_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_17 = this->accuracy_param_;
      }
      AccuracyParameter::Clear(this_17);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x15 & 1) != 0) {
      pHVar6 = this->hinge_loss_param_;
      if (pHVar6 == (HingeLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fad);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: hinge_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pHVar6 = this->hinge_loss_param_;
      }
      pHVar6->norm_ = 1;
      (pHVar6->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pHVar6->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pHVar6->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x16 & 1) != 0) {
      this_18 = this->relu_param_;
      if (this_18 == (ReLUParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb1);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: relu_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_18 = this->relu_param_;
      }
      ReLUParameter::Clear(this_18);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x17 & 1) != 0) {
      this_19 = this->slice_param_;
      if (this_19 == (SliceParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fb5);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: slice_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_19 = this->slice_param_;
      }
      SliceParameter::Clear(this_19);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if (0xffffff < uVar1) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      this_20 = this->mvn_param_;
      if (this_20 == (MVNParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbb);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: mvn_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_20 = this->mvn_param_;
      }
      MVNParameter::Clear(this_20);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      this_21 = this->transform_param_;
      if (this_21 == (TransformationParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fbf);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: transform_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_21 = this->transform_param_;
      }
      TransformationParameter::Clear(this_21);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      pTVar7 = this->tanh_param_;
      if (pTVar7 == (TanHParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc3);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: tanh_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pTVar7 = this->tanh_param_;
      }
      pTVar7->engine_ = 0;
      (pTVar7->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pTVar7->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pTVar7->_internal_metadata_)
        ;
      }
    }
    if (((this->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
      pSVar8 = this->sigmoid_param_;
      if (pSVar8 == (SigmoidParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fc7);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: sigmoid_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pSVar8 = this->sigmoid_param_;
      }
      pSVar8->engine_ = 0;
      (pSVar8->_has_bits_).has_bits_[0] = 0;
      if (((ulong)(pSVar8->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        google::protobuf::internal::InternalMetadataWithArena::DoClear(&pSVar8->_internal_metadata_)
        ;
      }
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    if ((uVar1 >> 0x1c & 1) != 0) {
      this_22 = this->softmax_param_;
      if (this_22 == (SoftmaxParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcb);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: softmax_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_22 = this->softmax_param_;
      }
      SoftmaxParameter::Clear(this_22);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      this_23 = this->contrastive_loss_param_;
      if (this_23 == (ContrastiveLossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fcf);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: contrastive_loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_23 = this->contrastive_loss_param_;
      }
      ContrastiveLossParameter::Clear(this_23);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 >> 0x1e & 1) != 0) {
      this_24 = this->exp_param_;
      if (this_24 == (ExpParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd3);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: exp_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_24 = this->exp_param_;
      }
      ExpParameter::Clear(this_24);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((int)uVar1 < 0) {
      this_25 = this->loss_param_;
      if (this_25 == (LossParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x9fd7);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: loss_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        this_25 = this->loss_param_;
      }
      LossParameter::Clear(this_25);
    }
  }
  this->type_ = 0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void V1LayerParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.V1LayerParameter)
  bottom_.Clear();
  top_.Clear();
  blobs_.Clear();
  blobs_lr_.Clear();
  weight_decay_.Clear();
  include_.Clear();
  exclude_.Clear();
  loss_weight_.Clear();
  param_.Clear();
  blob_share_mode_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_layer()) {
      GOOGLE_DCHECK(layer_ != NULL);
      layer_->::caffe::V0LayerParameter::Clear();
    }
    if (has_concat_param()) {
      GOOGLE_DCHECK(concat_param_ != NULL);
      concat_param_->::caffe::ConcatParameter::Clear();
    }
    if (has_convolution_param()) {
      GOOGLE_DCHECK(convolution_param_ != NULL);
      convolution_param_->::caffe::ConvolutionParameter::Clear();
    }
    if (has_data_param()) {
      GOOGLE_DCHECK(data_param_ != NULL);
      data_param_->::caffe::DataParameter::Clear();
    }
    if (has_dropout_param()) {
      GOOGLE_DCHECK(dropout_param_ != NULL);
      dropout_param_->::caffe::DropoutParameter::Clear();
    }
    if (has_hdf5_data_param()) {
      GOOGLE_DCHECK(hdf5_data_param_ != NULL);
      hdf5_data_param_->::caffe::HDF5DataParameter::Clear();
    }
    if (has_hdf5_output_param()) {
      GOOGLE_DCHECK(hdf5_output_param_ != NULL);
      hdf5_output_param_->::caffe::HDF5OutputParameter::Clear();
    }
  }
  if (_has_bits_[8 / 32] & 65280u) {
    if (has_image_data_param()) {
      GOOGLE_DCHECK(image_data_param_ != NULL);
      image_data_param_->::caffe::ImageDataParameter::Clear();
    }
    if (has_infogain_loss_param()) {
      GOOGLE_DCHECK(infogain_loss_param_ != NULL);
      infogain_loss_param_->::caffe::InfogainLossParameter::Clear();
    }
    if (has_inner_product_param()) {
      GOOGLE_DCHECK(inner_product_param_ != NULL);
      inner_product_param_->::caffe::InnerProductParameter::Clear();
    }
    if (has_lrn_param()) {
      GOOGLE_DCHECK(lrn_param_ != NULL);
      lrn_param_->::caffe::LRNParameter::Clear();
    }
    if (has_pooling_param()) {
      GOOGLE_DCHECK(pooling_param_ != NULL);
      pooling_param_->::caffe::PoolingParameter::Clear();
    }
    if (has_window_data_param()) {
      GOOGLE_DCHECK(window_data_param_ != NULL);
      window_data_param_->::caffe::WindowDataParameter::Clear();
    }
    if (has_power_param()) {
      GOOGLE_DCHECK(power_param_ != NULL);
      power_param_->::caffe::PowerParameter::Clear();
    }
    if (has_memory_data_param()) {
      GOOGLE_DCHECK(memory_data_param_ != NULL);
      memory_data_param_->::caffe::MemoryDataParameter::Clear();
    }
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    if (has_argmax_param()) {
      GOOGLE_DCHECK(argmax_param_ != NULL);
      argmax_param_->::caffe::ArgMaxParameter::Clear();
    }
    if (has_eltwise_param()) {
      GOOGLE_DCHECK(eltwise_param_ != NULL);
      eltwise_param_->::caffe::EltwiseParameter::Clear();
    }
    if (has_threshold_param()) {
      GOOGLE_DCHECK(threshold_param_ != NULL);
      threshold_param_->::caffe::ThresholdParameter::Clear();
    }
    if (has_dummy_data_param()) {
      GOOGLE_DCHECK(dummy_data_param_ != NULL);
      dummy_data_param_->::caffe::DummyDataParameter::Clear();
    }
    if (has_accuracy_param()) {
      GOOGLE_DCHECK(accuracy_param_ != NULL);
      accuracy_param_->::caffe::AccuracyParameter::Clear();
    }
    if (has_hinge_loss_param()) {
      GOOGLE_DCHECK(hinge_loss_param_ != NULL);
      hinge_loss_param_->::caffe::HingeLossParameter::Clear();
    }
    if (has_relu_param()) {
      GOOGLE_DCHECK(relu_param_ != NULL);
      relu_param_->::caffe::ReLUParameter::Clear();
    }
    if (has_slice_param()) {
      GOOGLE_DCHECK(slice_param_ != NULL);
      slice_param_->::caffe::SliceParameter::Clear();
    }
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    if (has_mvn_param()) {
      GOOGLE_DCHECK(mvn_param_ != NULL);
      mvn_param_->::caffe::MVNParameter::Clear();
    }
    if (has_transform_param()) {
      GOOGLE_DCHECK(transform_param_ != NULL);
      transform_param_->::caffe::TransformationParameter::Clear();
    }
    if (has_tanh_param()) {
      GOOGLE_DCHECK(tanh_param_ != NULL);
      tanh_param_->::caffe::TanHParameter::Clear();
    }
    if (has_sigmoid_param()) {
      GOOGLE_DCHECK(sigmoid_param_ != NULL);
      sigmoid_param_->::caffe::SigmoidParameter::Clear();
    }
    if (has_softmax_param()) {
      GOOGLE_DCHECK(softmax_param_ != NULL);
      softmax_param_->::caffe::SoftmaxParameter::Clear();
    }
    if (has_contrastive_loss_param()) {
      GOOGLE_DCHECK(contrastive_loss_param_ != NULL);
      contrastive_loss_param_->::caffe::ContrastiveLossParameter::Clear();
    }
    if (has_exp_param()) {
      GOOGLE_DCHECK(exp_param_ != NULL);
      exp_param_->::caffe::ExpParameter::Clear();
    }
    if (has_loss_param()) {
      GOOGLE_DCHECK(loss_param_ != NULL);
      loss_param_->::caffe::LossParameter::Clear();
    }
  }
  type_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}